

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindAllExtensionNumbers
          (MergedDescriptorDatabase *this,string *extendee_type,
          vector<int,_std::allocator<int>_> *output)

{
  int iVar1;
  pointer ppDVar2;
  bool bVar3;
  _Iter in_R8;
  ulong uVar4;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> __result;
  insert_iterator<std::vector<int,_std::allocator<int>_>_> __result_00;
  vector<int,_std::allocator<int>_> results;
  set<int,_std::less<int>,_std::allocator<int>_> merged_results;
  __copy_move<false,false,std::random_access_iterator_tag> *local_88;
  __copy_move<false,false,std::random_access_iterator_tag> *p_Stack_80;
  undefined8 local_78;
  _Base_ptr local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar3 = false;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = 0;
  local_88 = (__copy_move<false,false,std::random_access_iterator_tag> *)0x0;
  p_Stack_80 = (__copy_move<false,false,std::random_access_iterator_tag> *)0x0;
  ppDVar2 = (this->sources_).
            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->sources_).
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppDVar2) {
    uVar4 = 0;
    bVar3 = false;
    local_68 = (_Base_ptr)output;
    do {
      iVar1 = (*ppDVar2[uVar4]->_vptr_DescriptorDatabase[5])(ppDVar2[uVar4],extendee_type,&local_88)
      ;
      if ((char)iVar1 != '\0') {
        bVar3 = true;
        __result.iter._M_node = (_Base_ptr)in_R8._M_current;
        __result.container =
             (set<int,_std::less<int>,_std::allocator<int>_> *)
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<int*,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
                  (local_88,(int *)p_Stack_80,(int *)&local_60,__result);
      }
      if (p_Stack_80 != local_88) {
        p_Stack_80 = local_88;
      }
      uVar4 = uVar4 + 1;
      ppDVar2 = (this->sources_).
                super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      output = (vector<int,_std::allocator<int>_> *)local_68;
    } while (uVar4 < (ulong)((long)(this->sources_).
                                   super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar2 >> 3))
    ;
  }
  __result_00.iter._M_current = in_R8._M_current;
  __result_00.container = (vector<int,_std::allocator<int>_> *)((_Base_ptr)output)->_M_parent;
  std::__copy_move<false,false,std::bidirectional_iterator_tag>::
  __copy_m<std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::vector<int,std::allocator<int>>>>
            ((__copy_move<false,false,std::bidirectional_iterator_tag> *)
             local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<int>)&local_60._M_impl.super__Rb_tree_header,
             (_Rb_tree_const_iterator<int>)output,__result_00);
  if (local_88 != (__copy_move<false,false,std::random_access_iterator_tag> *)0x0) {
    operator_delete(local_88);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return bVar3;
}

Assistant:

bool MergedDescriptorDatabase::FindAllExtensionNumbers(
    const std::string& extendee_type, std::vector<int>* output) {
  std::set<int> merged_results;
  std::vector<int> results;
  bool success = false;

  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindAllExtensionNumbers(extendee_type, &results)) {
      std::copy(results.begin(), results.end(),
                std::insert_iterator<std::set<int> >(merged_results,
                                                     merged_results.begin()));
      success = true;
    }
    results.clear();
  }

  std::copy(merged_results.begin(), merged_results.end(),
            std::insert_iterator<std::vector<int> >(*output, output->end()));

  return success;
}